

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

Reader * __thiscall
capnp::TwoPartyVatNetwork::getPeerVatId(Reader *__return_storage_ptr__,TwoPartyVatNetwork *this)

{
  PointerBuilder local_68;
  Builder local_50;
  StructBuilder local_38;
  
  MessageBuilder::getRootInternal(&local_50,&(this->peerVatId).super_MessageBuilder);
  local_68.pointer = local_50.builder.pointer;
  local_68.segment = local_50.builder.segment;
  local_68.capTable = local_50.builder.capTable;
  capnp::_::PointerBuilder::getStruct(&local_38,&local_68,(StructSize)0x1,(word *)0x0);
  capnp::_::StructBuilder::asReader(&local_38);
  return __return_storage_ptr__;
}

Assistant:

rpc::twoparty::VatId::Reader TwoPartyVatNetwork::getPeerVatId() {
  return peerVatId.getRoot<rpc::twoparty::VatId>();
}